

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O0

void ByteRateToString(tchar_t *Out,size_t OutLen,int ByteRate)

{
  undefined1 local_68 [8];
  cc_fraction f;
  int KB;
  int ByteRate_local;
  size_t OutLen_local;
  tchar_t *Out_local;
  
  f.Den._0_4_ = (int)(((long)ByteRate * 8) / 1000);
  f.Den._4_4_ = ByteRate;
  if ((int)f.Den < 1000) {
    IntToString(Out,OutLen,(int)f.Den,0);
    tcscat_s(Out,OutLen," kbit/s");
  }
  else {
    local_68 = (undefined1  [8])(long)(int)f.Den;
    f.Num = 1000;
    FractionToString(Out,OutLen,(cc_fraction *)local_68,0,2);
    tcscat_s(Out,OutLen," Mbit/s");
  }
  return;
}

Assistant:

void ByteRateToString(tchar_t* Out, size_t OutLen, int ByteRate)
{
    int KB = Scale32(ByteRate,8,1000);
    if (KB>=1000)
    {
        cc_fraction f;
        f.Num = KB;
        f.Den = 1000;
        FractionToString(Out,OutLen,&f,0,2);
        tcscat_s(Out,OutLen,T(" Mbit/s"));
    }
    else
    {
        IntToString(Out,OutLen,KB,0);
        tcscat_s(Out,OutLen,T(" kbit/s"));
    }
}